

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O0

int Abc_SclCheckImprovement
              (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vNodes,Vec_Int_t *vEvals,int Notches,
              int DelayGap)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  abctime aVar2;
  SC_Cell *pOld;
  abctime aVar3;
  SC_Cell *pCell;
  Abc_Obj_t *p_00;
  float fVar4;
  abctime clk;
  int local_60;
  int gateBest;
  int k;
  int i;
  float dGainBest;
  float dGain;
  SC_Cell *pCellNew;
  SC_Cell *pCellOld;
  Abc_Obj_t *pTemp;
  int DelayGap_local;
  int Notches_local;
  Vec_Int_t *vEvals_local;
  Vec_Int_t *vNodes_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  aVar2 = Abc_Clock();
  pOld = Abc_SclObjCell(pObj);
  Abc_SclConeStore(p,vNodes);
  Abc_SclEvalStore(p,vEvals);
  Abc_SclLoadStore(p,pObj);
  clk._4_4_ = -1;
  k = (int)(float)-DelayGap;
  _dGainBest = pOld;
  for (gateBest = 0; gateBest == 0 || _dGainBest != pOld; gateBest = gateBest + 1) {
    if (_dGainBest->area < pOld->area) {
      if (Notches < gateBest) break;
      Abc_SclObjSetCell(pObj,_dGainBest);
      Abc_SclUpdateLoad(p,pObj,pOld,_dGainBest);
      Abc_SclTimeCone(p,vNodes);
      Abc_SclObjSetCell(pObj,pOld);
      Abc_SclLoadRestore(p,pObj);
      fVar4 = Abc_SclEvalPerformLegal(p,vEvals,p->MaxDelay0);
      if (((fVar4 != -1.0) || (NAN(fVar4))) && ((float)k < fVar4)) {
        clk._4_4_ = _dGainBest->Id;
        k = (int)fVar4;
      }
    }
    _dGainBest = _dGainBest->pPrev;
  }
  Abc_SclObjSetCell(pObj,pOld);
  Abc_SclConeRestore(p,vNodes);
  aVar3 = Abc_Clock();
  p->timeSize = (aVar3 - aVar2) + p->timeSize;
  if (clk._4_4_ < 0) {
    p_local._4_4_ = 0;
  }
  else {
    pCell = SC_LibCell(p->pLib,clk._4_4_);
    Abc_SclObjSetCell(pObj,pCell);
    p->SumArea = (pCell->area - pOld->area) + p->SumArea;
    for (local_60 = 0; iVar1 = Vec_IntSize(vNodes), local_60 < iVar1; local_60 = local_60 + 1) {
      pNtk = p->pNtk;
      iVar1 = Vec_IntEntry(vNodes,local_60);
      p_00 = Abc_NtkObj(pNtk,iVar1);
      if (p_00 != (Abc_Obj_t *)0x0) {
        Abc_NodeSetTravIdCurrent(p_00);
      }
    }
    Abc_SclUpdateLoad(p,pObj,pOld,pCell);
    Abc_SclTimeIncInsert(p,pObj);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_SclCheckImprovement( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vNodes, Vec_Int_t * vEvals, int Notches, int DelayGap )
{
    Abc_Obj_t * pTemp;
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int i, k, gateBest;
    abctime clk;
clk = Abc_Clock();
//    printf( "%d -> %d\n", Vec_IntSize(vNodes), Vec_IntSize(vEvals) );
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vNodes );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCellRev( pCellOld, pCellNew, i )
    {
        if ( pCellNew->area >= pCellOld->area )
            continue;
        if ( i > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vNodes );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // evaluate gain
        dGain = Abc_SclEvalPerformLegal( p, vEvals, p->MaxDelay0 );
        if ( dGain == -1 )
            continue;
        // save best gain
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
        }
    } 
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vNodes );
p->timeSize += Abc_Clock() - clk;
    if ( gateBest >= 0 )
    {
        pCellNew = SC_LibCell( p->pLib, gateBest );
        Abc_SclObjSetCell( pObj, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
//        printf( "%f   %f -> %f\n", pCellNew->area - pCellOld->area, p->SumArea - (pCellNew->area - pCellOld->area), p->SumArea );
//        printf( "%6d  %20s -> %20s  %f -> %f\n", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName, pCellOld->area, pCellNew->area );
        // mark used nodes with the current trav ID
        Abc_NtkForEachObjVec( vNodes, p->pNtk, pTemp, k )
            Abc_NodeSetTravIdCurrent( pTemp );
        // update load and timing...
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        Abc_SclTimeIncInsert( p, pObj );
        return 1;
    }
    return 0;
}